

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

json_t * json_object(void)

{
  int iVar1;
  json_object_t *object;
  
  object = (json_object_t *)jsonp_malloc(0x50);
  if (object == (json_object_t *)0x0) {
    object = (json_object_t *)0x0;
  }
  else {
    if (hashtable_seed == 0) {
      json_object_seed(0);
    }
    json_init((json_t *)object,JSON_OBJECT);
    iVar1 = hashtable_init(&object->hashtable);
    if (iVar1 == 0) {
      object->visited = 0;
    }
    else {
      jsonp_free(object);
      object = (json_object_t *)0x0;
    }
  }
  return &object->json;
}

Assistant:

json_t *json_object(void)
{
	json_object_t *object = jsonp_malloc(sizeof(json_object_t));
	if (!object)
		return NULL;

	if (!hashtable_seed) {
		/* Autoseed */
		json_object_seed(0);
	}

	json_init(&object->json, JSON_OBJECT);

	if (hashtable_init(&object->hashtable))
	{
		jsonp_free(object);
		return NULL;
	}

	object->visited = 0;

	return &object->json;
}